

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O0

void eglu::checkError(deUint32 err,char *message,char *file,int line)

{
  ostream *poVar1;
  BadAllocError *this;
  char *pcVar2;
  Error *this_00;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1c0 [2];
  ostringstream local_1a0 [8];
  ostringstream desc;
  int line_local;
  char *file_local;
  char *message_local;
  deUint32 err_local;
  
  if (err == 0x3000) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Got ");
  EVar3 = getErrorStr(err);
  local_1c0[0].m_getName = EVar3.m_getName;
  local_1c0[0].m_value = EVar3.m_value;
  tcu::Format::operator<<(poVar1,local_1c0);
  if (message != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a0,": ");
    std::operator<<(poVar1,message);
  }
  if (err == 0x3003) {
    this = (BadAllocError *)__cxa_allocate_exception(0x38);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    BadAllocError::BadAllocError(this,pcVar2,(char *)0x0,file,line);
    __cxa_throw(this,&BadAllocError::typeinfo,BadAllocError::~BadAllocError);
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  Error::Error(this_00,err,pcVar2,(char *)0x0,file,line);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void checkError (deUint32 err, const char* message, const char* file, int line)
{
	if (err != EGL_SUCCESS)
	{
		std::ostringstream desc;
		desc << "Got " << eglu::getErrorStr(err);
		if (message)
			desc << ": " << message;

		if (err == EGL_BAD_ALLOC)
			throw BadAllocError(desc.str().c_str(), DE_NULL, file, line);
		else
			throw Error(err, desc.str().c_str(), DE_NULL, file, line);
	}
}